

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayStencilAttachments.cpp
# Opt level: O0

bool __thiscall
glcts::TextureCubeMapArrayStencilAttachments::readPixelsAndCompareWithExpectedResult
          (TextureCubeMapArrayStencilAttachments *this,GLuint test_index)

{
  code *pcVar1;
  GLubyte *pGVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  GLuint GVar6;
  GLuint GVar7;
  deUint32 err;
  RenderContext *pRVar8;
  undefined4 extraout_var;
  TestLog *this_00;
  MessageBuilder *pMVar9;
  uint local_1f4;
  uint local_1f0;
  uint local_1ec;
  uint local_1e8;
  uint local_1e4;
  uint local_1e0;
  uint local_1dc;
  uint local_1d8 [4];
  MessageBuilder local_1c8;
  byte *local_48;
  GLubyte *data;
  GLubyte *pGStack_38;
  GLuint x;
  GLubyte *data_row;
  byte local_25;
  GLuint y;
  GLubyte expectedData [4];
  long lStack_20;
  bool has_test_failed;
  Functions *gl;
  GLuint test_index_local;
  TextureCubeMapArrayStencilAttachments *this_local;
  
  pRVar8 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar5 = (*pRVar8->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar5);
  y._3_1_ = 0;
  pcVar1 = *(code **)(lStack_20 + 0x1220);
  GVar6 = CubeMapArrayDataStorage::getWidth(this->m_cube_map_array_data + test_index);
  GVar7 = CubeMapArrayDataStorage::getHeight(this->m_cube_map_array_data + test_index);
  (*pcVar1)(0,0,GVar6,GVar7,0x1908,0x1401,this->m_result_data);
  err = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(err,"Could not read pixel data from color buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                  ,0x33d);
  memset(&local_25,0,4);
  data_row._4_4_ = 0;
  while( true ) {
    uVar3 = data_row._4_4_;
    GVar6 = CubeMapArrayDataStorage::getHeight(this->m_cube_map_array_data + test_index);
    uVar4 = data_row._4_4_;
    if (GVar6 <= uVar3) break;
    GVar6 = CubeMapArrayDataStorage::getHeight(this->m_cube_map_array_data + test_index);
    uVar3 = data_row._4_4_;
    if (uVar4 < GVar6 >> 1) {
      local_25 = 0xff;
      y._0_1_ = 0;
      y._1_1_ = 0;
      y._2_1_ = 0xff;
    }
    else {
      local_25 = 0;
      y._0_1_ = 0xff;
      y._1_1_ = 0xff;
      y._2_1_ = 0;
    }
    pGVar2 = this->m_result_data;
    GVar6 = CubeMapArrayDataStorage::getHeight(this->m_cube_map_array_data + test_index);
    pGStack_38 = pGVar2 + uVar3 * GVar6 * 4;
    data._4_4_ = 0;
    while( true ) {
      uVar3 = data._4_4_;
      GVar6 = CubeMapArrayDataStorage::getWidth(this->m_cube_map_array_data + test_index);
      if (GVar6 <= uVar3) break;
      local_48 = pGStack_38 + (data._4_4_ << 2);
      if ((((*local_48 != local_25) || (local_48[1] != (byte)y)) || (local_48[2] != y._1_1_)) ||
         (local_48[3] != y._2_1_)) {
        this_00 = tcu::TestContext::getLog
                            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_1c8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar9 = tcu::MessageBuilder::operator<<(&local_1c8,(char (*) [17])"Expected Data ( ");
        local_1d8[0] = (uint)local_25;
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,local_1d8);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [2])0x2c5c975);
        local_1dc = (uint)(byte)y;
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_1dc);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [2])0x2c5c975);
        local_1e0 = (uint)y._1_1_;
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_1e0);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [2])0x2c5c975);
        local_1e4 = (uint)y._2_1_;
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_1e4);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2b47c71);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [15])"Result Data ( ");
        local_1e8 = (uint)*local_48;
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_1e8);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [2])0x2c5c975);
        local_1ec = (uint)local_48[1];
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_1ec);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [2])0x2c5c975);
        local_1f0 = (uint)local_48[2];
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_1f0);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [2])0x2c5c975);
        local_1f4 = (uint)local_48[3];
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_1f4);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [2])0x2a85ff4);
        tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1c8);
        y._3_1_ = 1;
      }
      data._4_4_ = data._4_4_ + 1;
    }
    data_row._4_4_ = data_row._4_4_ + 1;
  }
  return (bool)(y._3_1_ & 1);
}

Assistant:

bool TextureCubeMapArrayStencilAttachments::readPixelsAndCompareWithExpectedResult(glw::GLuint test_index)
{
	const glw::Functions& gl			  = m_context.getRenderContext().getFunctions();
	bool				  has_test_failed = false;

	gl.readPixels(0 /* x */, 0 /* y */, m_cube_map_array_data[test_index].getWidth(),
				  m_cube_map_array_data[test_index].getHeight(), GL_RGBA, GL_UNSIGNED_BYTE, m_result_data);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not read pixel data from color buffer");

	glw::GLubyte expectedData[] = { 0, 0, 0, 0 };

	/* Loop over all pixels and compare the rendered data with reference values */
	for (glw::GLuint y = 0; y < m_cube_map_array_data[test_index].getHeight(); ++y)
	{
		/* Top half should be filled with different data than the bottom half */
		if (y >= m_cube_map_array_data[test_index].getHeight() / 2)
		{
			expectedData[0] = 0;
			expectedData[1] = 255;
			expectedData[2] = 255;
			expectedData[3] = 0;
		}
		else
		{
			expectedData[0] = 255;
			expectedData[1] = 0;
			expectedData[2] = 0;
			expectedData[3] = 255;
		}

		const glw::GLubyte* data_row =
			m_result_data + y * m_cube_map_array_data[test_index].getHeight() * m_n_cube_map_array_configurations;

		for (glw::GLuint x = 0; x < m_cube_map_array_data[test_index].getWidth(); ++x)
		{
			const glw::GLubyte* data = data_row + x * m_n_components;

			if (data[0] != expectedData[0] || data[1] != expectedData[1] || data[2] != expectedData[2] ||
				data[3] != expectedData[3])
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Expected Data ( " << (unsigned int)expectedData[0]
								   << "," << (unsigned int)expectedData[1] << "," << (unsigned int)expectedData[2]
								   << "," << (unsigned int)expectedData[3] << ") "
								   << "Result Data ( " << (unsigned int)data[0] << "," << (unsigned int)data[1] << ","
								   << (unsigned int)data[2] << "," << (unsigned int)data[3] << ")"
								   << tcu::TestLog::EndMessage;

				has_test_failed = true;
			}
		} /* for (all pixels in a row) */
	}	 /* for (all rows) */

	return has_test_failed;
}